

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_remove(void *voidhandle,bid_t bid)

{
  bid_t in_RSI;
  long in_RDI;
  size_t idx;
  size_t sb;
  int nitems;
  int subblock;
  int i;
  bid_t _bid;
  btreeblk_handle *handle;
  uint64_t in_stack_ffffffffffffffb8;
  btreeblk_handle *handle_00;
  size_t local_38;
  int local_2c;
  int local_28;
  int local_24;
  bid_t local_20;
  long local_18;
  bid_t local_10;
  
  handle_00 = (btreeblk_handle *)0x0;
  local_38 = 0;
  local_18 = in_RDI;
  local_10 = in_RSI;
  subbid2bid(in_RSI,&local_38,(size_t *)&stack0xffffffffffffffc0,&local_20);
  local_28 = is_subblock(local_10);
  if (local_28 == 0) {
    *(long *)(local_18 + 8) = *(long *)(local_18 + 8) + -1;
    _btreeblk_add_stale_block(handle_00,in_stack_ffffffffffffffb8,0);
  }
  else if (*(bid_t *)(*(long *)(local_18 + 0x60) + local_38 * 0x18) == local_20) {
    *(undefined1 *)
     ((long)&handle_00->nodesize + *(long *)(*(long *)(local_18 + 0x60) + local_38 * 0x18 + 0x10)) =
         0;
    local_2c = 0;
    for (local_24 = 0;
        local_24 < (int)(uint)*(ushort *)(*(long *)(local_18 + 0x60) + local_38 * 0x18 + 0xc);
        local_24 = local_24 + 1) {
      if (*(long *)(*(long *)(local_18 + 0x60) + local_38 * 0x18 + 0x10) != 0) {
        local_2c = local_2c + 1;
      }
    }
    if (local_2c == 0) {
      *(undefined8 *)(*(long *)(local_18 + 0x60) + local_38 * 0x18) = 0xffffffffffffffff;
      *(long *)(local_18 + 8) = *(long *)(local_18 + 8) + -1;
      _btreeblk_add_stale_block(handle_00,in_stack_ffffffffffffffb8,0);
    }
  }
  return;
}

Assistant:

void btreeblk_remove(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    bid_t _bid;
    int i, subblock, nitems;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    subblock = is_subblock(bid);

    if (subblock) {
        // subblock
        if (handle->sb[sb].bid == _bid) {
            // erase bitmap
            handle->sb[sb].bitmap[idx] = 0;
            // if all slots are empty, invalidate the block
            nitems = 0;
            for (i=0;i<handle->sb[sb].nblocks;++i){
                if (handle->sb[sb].bitmap) {
                    nitems++;
                }
            }
            if (nitems == 0) {
                handle->sb[sb].bid = BLK_NOT_FOUND;
                handle->nlivenodes--;
                _btreeblk_add_stale_block(handle,
                                          _bid * handle->nodesize,
                                          handle->nodesize);
            }
        }
    } else {
        // normal block
        handle->nlivenodes--;
        _btreeblk_add_stale_block(handle,
                                  _bid * handle->nodesize,
                                  handle->nodesize);
    }
}